

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O2

int cfg_tobin_strptr(void *reference,size_t bin_size,const_strarray *value)

{
  char *pcVar1;
  
  if (bin_size == 8) {
    free(*reference);
    pcVar1 = strdup(value->value);
    *(char **)reference = pcVar1;
    return -(uint)(pcVar1 == (char *)0x0);
  }
  return -1;
}

Assistant:

int
cfg_tobin_strptr(void *reference, size_t bin_size, const struct const_strarray *value) {
  char **ptr;

  if (bin_size != sizeof(*ptr)) {
    return -1;
  }

  ptr = (char **)reference;
  if (*ptr) {
    free(*ptr);
  }

  *ptr = strdup(strarray_get_first_c(value));
  return *ptr == NULL ? -1 : 0;
}